

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

ITexture * __thiscall
irr::video::CNullDriver::addTextureCubemap
          (CNullDriver *this,u32 sideLen,path *name,ECOLOR_FORMAT format)

{
  IImage *this_00;
  ITexture *texture;
  int i;
  long lVar1;
  CNullDriver *pCVar2;
  int iVar3;
  bool bVar4;
  double in_XMM0_Qa;
  dimension2d<unsigned_int> local_70;
  path *local_68;
  CNullDriver *local_60;
  IImage *local_58;
  array<irr::video::IImage_*> imageArray;
  undefined4 extraout_var;
  
  if (sideLen == 0) {
    return (ITexture *)0x0;
  }
  if ((int)(name->str)._M_string_length == 0) {
    os::Printer::log((Printer *)"Could not create ITexture, texture needs to have a non-empty name."
                     ,in_XMM0_Qa);
    return (ITexture *)0x0;
  }
  pCVar2 = (CNullDriver *)&imageArray;
  iVar3 = 6;
  local_68 = name;
  local_60 = this;
  core::array<irr::video::IImage_*>::array((array<irr::video::IImage_*> *)pCVar2,6);
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    this_00 = (IImage *)operator_new(0x50);
    local_70.Width = sideLen;
    local_70.Height = sideLen;
    CImage::CImage((CImage *)this_00,format,&local_70);
    pCVar2 = (CNullDriver *)&imageArray;
    local_58 = this_00;
    core::array<irr::video::IImage_*>::push_back((array<irr::video::IImage_*> *)pCVar2,&local_58);
  }
  bVar4 = checkImage(pCVar2,&imageArray);
  pCVar2 = local_60;
  if (bVar4) {
    iVar3 = (*(local_60->super_IVideoDriver)._vptr_IVideoDriver[0x76])
                      (local_60,local_68,&imageArray);
    texture = (ITexture *)CONCAT44(extraout_var,iVar3);
    if (texture != (ITexture *)0x0) {
      addTexture(pCVar2,texture);
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&texture->_vptr_ITexture + (long)texture->_vptr_ITexture[-3]));
      goto LAB_001ebb98;
    }
  }
  texture = (ITexture *)0x0;
LAB_001ebb98:
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&imageArray.m_data.
                       super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar1]->_vptr_IImage +
               (long)imageArray.m_data.
                     super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar1]->_vptr_IImage[-3]));
  }
  std::_Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>::~_Vector_base
            ((_Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_> *)
             &imageArray);
  return texture;
}

Assistant:

ITexture *CNullDriver::addTextureCubemap(const irr::u32 sideLen, const io::path &name, ECOLOR_FORMAT format)
{
	if (0 == sideLen)
		return 0;

	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	core::array<IImage *> imageArray(6);
	for (int i = 0; i < 6; ++i)
		imageArray.push_back(new CImage(format, core::dimension2du(sideLen, sideLen)));

	ITexture *t = 0;
	if (checkImage(imageArray)) {
		t = createDeviceDependentTextureCubemap(name, imageArray);

		if (t) {
			addTexture(t);
			t->drop();
		}
	}

	for (int i = 0; i < 6; ++i)
		imageArray[i]->drop();

	return t;
}